

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O0

float fp32_from_bits(uint32_t w)

{
  anon_union_4_2_5fd15f10 fp32;
  uint32_t w_local;
  
  return (float)w;
}

Assistant:

static inline float fp32_from_bits(uint32_t w) {
        union {
            uint32_t as_bits;
            float as_value;
        } fp32;
        fp32.as_bits = w;
        return fp32.as_value;
    }